

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O0

void uts_initRoot(Node *root,int type)

{
  int type_local;
  Node *root_local;
  
  root->type = type;
  root->height = 0;
  root->numChildren = -1;
  rng_init((root->state).state,rootId);
  if ((debug & 1U) != 0) {
    printf("root node of type %d at %p\n",(ulong)(uint)type,root);
  }
  return;
}

Assistant:

void uts_initRoot(Node * root, int type) {
  root->type = type;
  root->height = 0;
  root->numChildren = -1;      // means not yet determined
  rng_init(root->state.state, rootId);

  if (debug & 1)
    printf("root node of type %d at %p\n",type, root);
}